

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O3

bool bloaty::RollupOutput::IsSame(string *a,string *b)

{
  size_t __n;
  ulong uVar1;
  pointer pcVar2;
  long *plVar3;
  int iVar4;
  pointer pcVar5;
  long *plVar6;
  bool bVar7;
  long *local_78;
  ulong local_70;
  long local_68 [2];
  pointer local_58;
  long *local_50;
  ulong local_48;
  long local_40 [2];
  
  __n = a->_M_string_length;
  uVar1 = b->_M_string_length;
  if (__n == uVar1) {
    if (__n == 0) {
      return true;
    }
    local_58 = (b->_M_dataplus)._M_p;
    pcVar5 = (a->_M_dataplus)._M_p;
    iVar4 = bcmp(pcVar5,local_58,__n);
    if (iVar4 == 0) {
      return true;
    }
  }
  else {
    local_58 = (b->_M_dataplus)._M_p;
    pcVar5 = (a->_M_dataplus)._M_p;
  }
  local_78 = local_68;
  std::__cxx11::string::_M_construct<char*>((string *)&local_78,pcVar5,pcVar5 + __n);
  std::__cxx11::string::append((char *)&local_78);
  plVar6 = local_78;
  bVar7 = true;
  if ((local_70 != 0) &&
     ((uVar1 < local_70 ||
      (iVar4 = bcmp(local_58 + (uVar1 - local_70),local_78,local_70), iVar4 != 0)))) {
    pcVar5 = (a->_M_dataplus)._M_p;
    uVar1 = a->_M_string_length;
    pcVar2 = (b->_M_dataplus)._M_p;
    local_50 = local_40;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar2,pcVar2 + b->_M_string_length);
    std::__cxx11::string::append((char *)&local_50);
    plVar3 = local_50;
    if (local_48 == 0) {
      bVar7 = true;
    }
    else if (uVar1 < local_48) {
      bVar7 = false;
    }
    else {
      iVar4 = bcmp(pcVar5 + (uVar1 - local_48),local_50,local_48);
      bVar7 = iVar4 == 0;
    }
    plVar6 = local_78;
    if (plVar3 != local_40) {
      operator_delete(plVar3,local_40[0] + 1);
      plVar6 = local_78;
    }
  }
  if (plVar6 != local_68) {
    operator_delete(plVar6,local_68[0] + 1);
  }
  return bVar7;
}

Assistant:

bool RollupOutput::IsSame(const std::string& a, const std::string& b) {
  if (a == b) {
    return true;
  }

  if (absl::EndsWith(b, a + "]") || absl::EndsWith(a, b + "]")) {
    return true;
  }

  return false;
}